

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,dynbuf *req)

{
  connectdata *pcVar1;
  char *first;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  Curl_HttpReq CVar5;
  CURLcode CVar6;
  byte *pbVar7;
  char *pcVar8;
  byte *pbVar9;
  char *second;
  undefined7 in_register_00000031;
  curl_slist *pcVar10;
  byte *pbVar11;
  bool bVar12;
  curl_slist *h [2];
  long local_60;
  curl_slist *local_48 [2];
  long local_38;
  
  pcVar1 = data->conn;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    local_48[0] = (data->set).headers;
    local_60 = 1;
    if (((*(uint *)&(pcVar1->bits).field_0x4 & 9) == 1) && (((data->set).field_0x9a0 & 0x10) != 0))
    {
      local_48[1] = (data->set).proxyheaders;
      local_60 = 2;
    }
  }
  else {
    if (((data->set).field_0x9a0 & 0x10) == 0) {
      local_48[0] = (data->set).headers;
    }
    else {
      local_48[0] = (data->set).proxyheaders;
    }
    local_60 = 1;
  }
  local_38 = 0;
  do {
    for (pcVar10 = local_48[local_38]; pcVar10 != (curl_slist *)0x0; pcVar10 = pcVar10->next) {
      pcVar8 = pcVar10->data;
      pbVar7 = (byte *)strchr(pcVar8,0x3a);
      if (pbVar7 == (byte *)0x0) {
        pbVar7 = (byte *)strchr(pcVar8,0x3b);
        pbVar2 = pbVar7;
        pbVar3 = pbVar7;
        if (pbVar7 != (byte *)0x0) {
          do {
            pbVar11 = pbVar3;
            pbVar9 = pbVar2;
            if (pbVar11[1] == 0) goto LAB_00123b6e;
            iVar4 = Curl_isspace((uint)pbVar11[1]);
            pbVar2 = pbVar9 + 1;
            pbVar3 = pbVar11 + 1;
          } while (iVar4 != 0);
          if (pbVar11[1] == 0) {
LAB_00123b6e:
            if (*pbVar11 != 0x3b) goto LAB_001239e1;
            pcVar8 = (*Curl_cstrdup)(pcVar10->data);
            if (pcVar8 == (char *)0x0) {
              Curl_dyn_free(req);
              return CURLE_OUT_OF_MEMORY;
            }
            pbVar9[(long)pcVar8 - (long)pcVar10->data] = 0x3a;
            pbVar7 = pbVar9 + ((long)pcVar8 - (long)pcVar10->data);
            goto LAB_001239e7;
          }
        }
      }
      else {
LAB_001239e1:
        pcVar8 = (char *)0x0;
LAB_001239e7:
        do {
          pbVar7 = pbVar7 + 1;
          if (*pbVar7 == 0) {
            bVar12 = false;
            goto LAB_00123a06;
          }
          iVar4 = Curl_isspace((uint)*pbVar7);
        } while (iVar4 != 0);
        bVar12 = *pbVar7 != 0;
LAB_00123a06:
        if ((pcVar8 != (char *)0x0) || (bVar12)) {
          second = pcVar8;
          if (pcVar8 == (char *)0x0) {
            second = pcVar10->data;
          }
          if (((data->state).aptr.host == (char *)0x0) ||
             (iVar4 = curl_strnequal("Host:",second,5), iVar4 == 0)) {
            CVar5 = (data->state).httpreq;
            if (CVar5 == HTTPREQ_POST_FORM) {
              iVar4 = curl_strnequal("Content-Type:",second,0xd);
              if (iVar4 != 0) goto LAB_00123b07;
              CVar5 = (data->state).httpreq;
            }
            if (((((CVar5 == HTTPREQ_POST_MIME) &&
                  (iVar4 = curl_strnequal("Content-Type:",second,0xd), iVar4 != 0)) ||
                 ((((pcVar1->bits).field_0x6 & 2) != 0 &&
                  (iVar4 = curl_strnequal("Content-Length:",second,0xf), iVar4 != 0)))) ||
                ((((data->state).aptr.te != (char *)0x0 &&
                  (iVar4 = curl_strnequal("Connection:",second,0xb), iVar4 != 0)) ||
                 ((0x13 < pcVar1->httpversion &&
                  (iVar4 = curl_strnequal("Transfer-Encoding:",second,0x12), iVar4 != 0)))))) ||
               ((((iVar4 = curl_strnequal("Authorization:",second,0xe), iVar4 != 0 ||
                  (iVar4 = curl_strnequal("Cookie:",second,7), iVar4 != 0)) &&
                 (((data->state).field_0x660 & 2) != 0)) &&
                (((first = (data->state).first_host, first != (char *)0x0 &&
                  (((data->set).field_0x9a3 & 1) == 0)) &&
                 (iVar4 = Curl_strcasecompare(first,(pcVar1->host).name), iVar4 == 0))))))
            goto LAB_00123b07;
            CVar6 = Curl_dyn_addf(req,"%s\r\n",second);
          }
          else {
LAB_00123b07:
            CVar6 = CURLE_OK;
          }
          if (pcVar8 != (char *)0x0) {
            (*Curl_cfree)(pcVar8);
          }
          if (CVar6 != CURLE_OK) {
            return CVar6;
          }
        }
      }
    }
    local_38 = local_38 + 1;
    if (local_38 == local_60) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect,
#ifndef USE_HYPER
                                 struct dynbuf *req
#else
                                 void *req
#endif
  )
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
#ifndef USE_HYPER
                Curl_dyn_free(req);
#endif
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(data->state.aptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(data->state.aptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
#ifdef USE_HYPER
            result = Curl_hyper_header(data, req, compare);
#else
            result = Curl_dyn_addf(req, "%s\r\n", compare);
#endif
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}